

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

bool ON_XMLNodePrivate::GetNextTag(ON_wString *tag,wchar_t **pBuffer,bool bValidateTag)

{
  bool bVar1;
  wchar_t *wsz;
  wchar_t *pwVar2;
  int numChars;
  wchar_t *pwVar3;
  wchar_t wVar4;
  
  wsz = *pBuffer;
  while( true ) {
    if (*wsz == L'\0') {
      return false;
    }
    if (*wsz == L'<') break;
    wsz = wsz + 1;
  }
LAB_0067d5ce:
  wVar4 = wsz[1];
  if (wVar4 == L'?') {
    pwVar3 = wsz + -1;
    wVar4 = L'<';
    do {
      if (wVar4 == L'?') {
        wVar4 = wsz[1];
        if (wVar4 == L'>') goto LAB_0067d600;
      }
      else {
        if (wVar4 == L'\0') {
          return false;
        }
        wVar4 = wsz[1];
      }
      wsz = wsz + 1;
      pwVar3 = pwVar3 + 1;
    } while( true );
  }
  goto LAB_0067d615;
LAB_0067d600:
  do {
    wsz = pwVar3 + 1;
    pwVar2 = pwVar3 + 1;
    pwVar3 = wsz;
  } while (*pwVar2 != L'<');
  goto LAB_0067d5ce;
LAB_0067d615:
  if (((wVar4 != L'!') || (wsz[2] != L'-')) || (wsz[3] != L'-')) {
    wVar4 = L'<';
    numChars = 1;
    pwVar3 = wsz;
    while( true ) {
      pwVar3 = pwVar3 + 1;
      if (wVar4 == L'\0') {
        return false;
      }
      if (wVar4 == L'>') break;
      wVar4 = *pwVar3;
      numChars = numChars + 1;
    }
    *pBuffer = pwVar3;
    if (numChars < 2) {
      return false;
    }
    ON_wString::Set(tag,wsz,numChars);
    if (!bValidateTag) {
      return true;
    }
    bVar1 = AssertValidTag(tag);
    if (!bVar1) {
      AttemptToFixTag(tag);
      AssertValidTag(tag);
      return true;
    }
    return true;
  }
  pwVar3 = wsz + -1;
  wVar4 = L'<';
  do {
    if (wVar4 == L'-') {
      wVar4 = wsz[1];
      if ((wVar4 == L'-') && (wVar4 = L'-', wsz[2] == L'>')) break;
    }
    else {
      if (wVar4 == L'\0') {
        return false;
      }
      wVar4 = wsz[1];
    }
    wsz = wsz + 1;
    pwVar3 = pwVar3 + 1;
  } while( true );
  do {
    pwVar2 = pwVar3;
    wsz = pwVar2 + 1;
    pwVar3 = wsz;
  } while (pwVar2[1] != L'<');
  wVar4 = pwVar2[2];
  goto LAB_0067d615;
}

Assistant:

bool ON_XMLNodePrivate::GetNextTag(ON_wString& tag, wchar_t*& pBuffer, bool bValidateTag) // Static.
{
  auto* start = pBuffer;
  while (*start != L'<')
  {
    if (0 == *start)
    {
      OUTPUT_DEBUG_STRING_EOL(L"Start of tag '<' not found");
      return false;
    }

    start++;
  }

  while (start[1] == L'?')
  {
    // This is a nasty document description tag - need to look for the end tag and skip it.
    while (!(start[0] == L'?' && start[1] == L'>'))
    {
      if (0 == *start)
      {
        OUTPUT_DEBUG_STRING_EOL(L"End of document description tag '>' not found");
        return false;
      }

      start++;
    }

    while (*start != L'<')
    {
      start++;
    }
  }

  while ((start[1] == L'!') && (start[2] == L'-') && (start[3] == L'-'))
  {
    // This is a comment tag - need to look for the end tag and skip it.
    while (!(start[0] == L'-' && start[1] == L'-' && start[2] == L'>'))
    {
      if (0 == *start)
      {
        OUTPUT_DEBUG_STRING_EOL(L"End of comment tag '>' not found");
        return false;
      }

      start++;
    }

    while (*start != L'<')
    {
      start++;
    }
  }

  wchar_t* pEnd = start;
  while (*pEnd != L'>')
  {
    if (0 == *pEnd)
    {
      OUTPUT_DEBUG_STRING_EOL(L"End of tag '>' not found");
      return false;
    }

    pEnd++;
  }

  pBuffer = pEnd + 1;

  // Copy the tag into the ready-made string.
  const auto numChars = int(pEnd - start + 1);
  if (numChars < 2)
    return false;

  tag.Set(start, numChars);

  if (bValidateTag)
  {
    if (!AssertValidTag(tag))
    {
      AttemptToFixTag(tag);
      AssertValidTag(tag);
    }
  }

  return true;
}